

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib537.c
# Opt level: O0

int fopen_works(void)

{
  FILE *pFVar1;
  int *piVar2;
  int local_30;
  int local_2c;
  int ret;
  int i;
  FILE *fpa [3];
  
  local_30 = 1;
  for (local_2c = 0; local_2c < 3; local_2c = local_2c + 1) {
    (&ret + (long)local_2c * 2)[0] = 0;
    (&ret + (long)local_2c * 2)[1] = 0;
  }
  local_2c = 0;
  do {
    if (2 < local_2c) {
LAB_00103134:
      for (local_2c = 0; local_2c < 3; local_2c = local_2c + 1) {
        if (*(long *)(&ret + (long)local_2c * 2) != 0) {
          fclose(*(FILE **)(&ret + (long)local_2c * 2));
        }
      }
      return local_30;
    }
    pFVar1 = fopen64("/dev/null","r");
    *(FILE **)(&ret + (long)local_2c * 2) = pFVar1;
    if (*(long *)(&ret + (long)local_2c * 2) == 0) {
      piVar2 = __errno_location();
      store_errmsg("fopen failed",*piVar2);
      curl_mfprintf(_stderr,"%s\n",msgbuff);
      local_30 = 0;
      goto LAB_00103134;
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

static int fopen_works(void)
{
  FILE *fpa[3];
  int i;
  int ret = 1;

  for(i = 0; i < 3; i++) {
    fpa[i] = NULL;
  }
  for(i = 0; i < 3; i++) {
    fpa[i] = fopen(DEV_NULL, FOPEN_READTEXT);
    if(fpa[i] == NULL) {
      store_errmsg("fopen failed", errno);
      fprintf(stderr, "%s\n", msgbuff);
      ret = 0;
      break;
    }
  }
  for(i = 0; i < 3; i++) {
    if(fpa[i] != NULL)
      fclose(fpa[i]);
  }
  return ret;
}